

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::iterate
          (InterInvocationTestCase *this)

{
  ostringstream *poVar1;
  int *value;
  int *value_00;
  ostringstream *poVar2;
  TestContext *this_00;
  InterInvocationTestCase *pIVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  undefined4 extraout_var_00;
  void *__src;
  TestError *this_01;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  allocator<char> local_1e1;
  InterInvocationTestCase *local_1e0;
  int local_1d4;
  vector<int,_std::allocator<int>_> results;
  MessageBuilder local_1b0;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  local_1e0 = (InterInvocationTestCase *)
              CONCAT44(local_1e0._4_4_,this->m_workWidth / this->m_localWidth);
  local_1d4 = this->m_workHeight / this->m_localHeight;
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Dispatching compute.\n");
  std::operator<<((ostream *)poVar2,"\tgroup size: ");
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1b0,&this->m_localWidth);
  std::operator<<((ostream *)&pMVar8->m_str,"x");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_localHeight);
  poVar1 = &pMVar8->m_str;
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tdispatch size: ");
  std::ostream::operator<<(poVar1,(int)local_1e0);
  std::operator<<((ostream *)poVar1,"x");
  std::ostream::operator<<(poVar1,local_1d4);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\ttotal work size: ");
  value = &this->m_workWidth;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
  std::operator<<((ostream *)&pMVar8->m_str,"x");
  value_00 = &this->m_workHeight;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value_00);
  std::operator<<((ostream *)&pMVar8->m_str,"\n");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  (**(code **)(lVar9 + 0x1680))((this->m_program->m_program).m_program);
  if (this->m_storage == STORAGE_IMAGE) {
    bVar5 = this->m_aliasingStorages;
    (**(code **)(lVar9 + 0x80))(1,this->m_storageTex,0,0,0,0x88ba,0x8235);
    if (bVar5 == false) {
      dVar7 = (**(code **)(lVar9 + 0x800))();
      pcVar10 = "bind result buf";
      iVar6 = 0x160;
LAB_0048ccb3:
      glu::checkError(dVar7,pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,iVar6);
      goto LAB_0048ccbb;
    }
    (**(code **)(lVar9 + 0x80))(2,this->m_storageTex,0,0,0,0x88ba,0x8235);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"bind result buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x167);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Binding same texture level to image storages.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) goto LAB_0048ccbb;
    bVar5 = this->m_aliasingStorages;
    (**(code **)(lVar9 + 0x48))(0x90d2,1,this->m_storageBuf);
    if (bVar5 == false) {
      dVar7 = (**(code **)(lVar9 + 0x800))();
      pcVar10 = "bind source buf";
      iVar6 = 0x153;
      goto LAB_0048ccb3;
    }
    (**(code **)(lVar9 + 0x48))(0x90d2,2,this->m_storageBuf);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"bind source buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x159);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Binding same buffer object to buffer storages.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
LAB_0048ccbb:
  (**(code **)(lVar9 + 0x48))(0x90d2,0,this->m_resultBuf);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"bind result buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x170);
  (**(code **)(lVar9 + 0x528))((ulong)local_1e0 & 0xffffffff,local_1d4,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"dispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x174);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  std::vector<int,_std::allocator<int>_>::vector
            (&results,(long)(this->m_workHeight * this->m_workWidth),(allocator_type *)&local_1b0);
  (**(code **)(lVar9 + 0x40))(0x90d2,this->m_resultBuf);
  __src = (void *)(**(code **)(lVar9 + 0xd00))(0x90d2,0,(long)(*value_00 * *value) << 2,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"map buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x182);
  memcpy(results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,__src,(long)(*value_00 * *value) << 2);
  cVar4 = (**(code **)(lVar9 + 0x1670))(0x90d2);
  local_1e0 = this;
  if (cVar4 != '\x01') {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"memory map store corrupted",&local_1e1);
    tcu::TestError::TestError(this_01,(string *)&local_1b0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar11 = 0;
  poVar1 = &local_1b0.m_str;
  lVar9 = 0;
  lVar12 = 0;
  iVar6 = 0;
  bVar5 = false;
  do {
    pIVar3 = local_1e0;
    if ((int)((ulong)((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) <= lVar12) {
      if (bVar5) {
LAB_0048cfb1:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&results.super__Vector_base<int,_std::allocator<int>_>);
        this_00 = (pIVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar10 = "image";
        if (pIVar3->m_storage == STORAGE_BUFFER) {
          pcVar10 = "buffer";
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&results,pcVar10,&local_1e1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results
                       ," content verification failed");
        tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1b0.m_log);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&results);
      }
      else {
        local_1b0.m_log =
             ((local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Result buffer ok.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&results.super__Vector_base<int,_std::allocator<int>_>);
        tcu::TestContext::setTestResult
                  ((pIVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    if (*(int *)((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9) != 1) {
      if (iVar6 == 0) {
        local_1b0.m_log =
             ((local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"Result buffer failed, got unexpected values.\n");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        iVar6 = 1;
      }
      else {
        if (4 < iVar6) {
          local_1b0.m_log =
               ((local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = &local_1b0.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"\t-- too many errors, skipping verification --\n");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          goto LAB_0048cfb1;
        }
        iVar6 = iVar6 + 1;
      }
      local_1b0.m_log = ((local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"\tError at index ");
      std::ostream::operator<<(poVar1,iVar11);
      std::operator<<((ostream *)poVar1,": expected 1, got ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (int *)((long)results.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar9));
      std::operator<<((ostream *)&pMVar8->m_str,".\n");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      bVar5 = true;
    }
    lVar12 = lVar12 + 1;
    lVar9 = lVar9 + 4;
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

InterInvocationTestCase::IterateResult InterInvocationTestCase::iterate (void)
{
	// Dispatch
	runCompute();

	// Verify buffer contents
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}